

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

bool EDCircles::CircleFit(double *x,double *y,int N,double *pxc,double *pyc,double *pr,double *pe)

{
  undefined1 auVar1 [16];
  double dVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  
  *pe = 1e+20;
  if (2 < N) {
    uVar4 = (ulong)(uint)N;
    auVar12 = ZEXT816(0);
    uVar3 = 0;
    do {
      dVar5 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + x[uVar3];
      auVar12._8_8_ = dVar5 + y[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    dVar13 = (double)N;
    auVar1._8_4_ = SUB84(dVar13,0);
    auVar1._0_8_ = dVar13;
    auVar1._12_4_ = (int)((ulong)dVar13 >> 0x20);
    auVar12 = divpd(auVar12,auVar1);
    dVar5 = 0.0;
    dVar6 = 0.0;
    dVar14 = 0.0;
    uVar3 = 0;
    dVar8 = 0.0;
    dVar7 = 0.0;
    dVar9 = 0.0;
    dVar10 = 0.0;
    do {
      dVar11 = x[uVar3] - auVar12._0_8_;
      dVar2 = y[uVar3] - auVar12._8_8_;
      dVar5 = dVar5 + dVar11 * dVar11;
      dVar6 = dVar6 + dVar11 * dVar2;
      dVar9 = dVar9 + dVar11 * dVar11 * dVar11;
      dVar10 = dVar10 + dVar2 * dVar2;
      dVar14 = dVar14 + dVar11 * dVar2 * dVar2;
      dVar8 = dVar8 + dVar2 * dVar2 * dVar2;
      dVar7 = dVar7 + dVar11 * dVar2 * dVar11;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    dVar11 = dVar5 * dVar10 - dVar6 * dVar6;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar9 = (dVar14 + dVar9) * 0.5;
      dVar7 = (dVar7 + dVar8) * 0.5;
      dVar8 = (dVar10 * dVar9 + dVar7 * -dVar6) / dVar11;
      dVar11 = (dVar9 * -dVar6 + dVar5 * dVar7) / dVar11;
      dVar5 = (dVar10 + dVar5) / dVar13 + dVar8 * dVar8 + dVar11 * dVar11;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      *pxc = dVar8 + auVar12._0_8_;
      dVar11 = auVar12._8_8_ + dVar11;
      *pyc = dVar11;
      dVar6 = 0.0;
      uVar3 = 0;
      do {
        dVar7 = y[uVar3] - dVar11;
        dVar7 = SQRT((x[uVar3] - *pxc) * (x[uVar3] - *pxc) + dVar7 * dVar7) - dVar5;
        dVar6 = dVar6 + dVar7 * dVar7;
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
      *pr = dVar5;
      dVar6 = dVar6 / dVar13;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      *pe = dVar6;
      return true;
    }
  }
  return false;
}

Assistant:

bool EDCircles::CircleFit(double * x, double * y, int N, double * pxc, double * pyc, double * pr, double * pe)
{
	*pe = 1e20;
	if (N < 3) return false;

	double xAvg = 0;
	double yAvg = 0;

	for (int i = 0; i<N; i++) {
		xAvg += x[i];
		yAvg += y[i];
	} //end-for

	xAvg /= N;
	yAvg /= N;

	double Suu = 0;
	double Suv = 0;
	double Svv = 0;
	double Suuu = 0;
	double Suvv = 0;
	double Svvv = 0;
	double Svuu = 0;
	for (int i = 0; i<N; i++) {
		double u = x[i] - xAvg;
		double v = y[i] - yAvg;

		Suu += u*u;
		Suv += u*v;
		Svv += v*v;
		Suuu += u*u*u;
		Suvv += u*v*v;
		Svvv += v*v*v;
		Svuu += v*u*u;
	} //end-for

	  // Now, we solve for the following linear system of equations
	  // Av = b, where v = (uc, vc) is the center of the circle
	  //
	  // |N    Suv| |uc| = |b1|
	  // |Suv  Svv| |vc| = |b2|
	  //
	  // where b1 = 0.5*(Suuu+Suvv) and b2 = 0.5*(Svvv+Svuu)
	  //
	double detA = Suu*Svv - Suv*Suv;
	if (detA == 0) return false;

	double b1 = 0.5*(Suuu + Suvv);
	double b2 = 0.5*(Svvv + Svuu);

	double uc = (Svv*b1 - Suv*b2) / detA;
	double vc = (Suu*b2 - Suv*b1) / detA;

	double R = sqrt(uc*uc + vc*vc + (Suu + Svv) / N);

	*pxc = uc + xAvg;
	*pyc = vc + yAvg;

	// Compute mean square error
	double error = 0;
	for (int i = 0; i<N; i++) {
		double dx = x[i] - *pxc;
		double dy = y[i] - *pyc;
		double d = sqrt(dx*dx + dy*dy) - R;
		error += d*d;
	} //end-for

	*pr = R;
	*pe = sqrt(error / N);

	return true;
}